

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O1

wchar_t archive_write_disk_set_group_lookup
                  (archive *_a,void *private_data,
                  _func_la_int64_t_void_ptr_char_ptr_la_int64_t *lookup_gid,
                  _func_void_void_ptr *cleanup_gid)

{
  code *pcVar1;
  int iVar2;
  wchar_t wVar3;
  
  iVar2 = __archive_check_magic(_a,0xc001b0c5,0x7fff,"archive_write_disk_set_group_lookup");
  wVar3 = L'\xffffffe2';
  if (iVar2 != -0x1e) {
    pcVar1 = (code *)_a[1].error_string.length;
    if ((pcVar1 != (code *)0x0) && (_a[1].error_string.buffer_length != 0)) {
      (*pcVar1)();
    }
    _a[1].error_string.s = (char *)lookup_gid;
    _a[1].error_string.length = (size_t)cleanup_gid;
    _a[1].error_string.buffer_length = (size_t)private_data;
    wVar3 = L'\0';
  }
  return wVar3;
}

Assistant:

int
archive_write_disk_set_group_lookup(struct archive *_a,
    void *private_data,
    la_int64_t (*lookup_gid)(void *private, const char *gname, la_int64_t gid),
    void (*cleanup_gid)(void *private))
{
	struct archive_write_disk *a = (struct archive_write_disk *)_a;
	archive_check_magic(&a->archive, ARCHIVE_WRITE_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_write_disk_set_group_lookup");

	if (a->cleanup_gid != NULL && a->lookup_gid_data != NULL)
		(a->cleanup_gid)(a->lookup_gid_data);

	a->lookup_gid = lookup_gid;
	a->cleanup_gid = cleanup_gid;
	a->lookup_gid_data = private_data;
	return (ARCHIVE_OK);
}